

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

double __thiscall
soplex::SSVectorBase<double>::operator*(SSVectorBase<double> *this,SSVectorBase<double> *w)

{
  int *piVar1;
  pointer pdVar2;
  int *piVar3;
  pointer pdVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  setup(this);
  iVar10 = (this->super_IdxSet).num;
  iVar12 = (w->super_IdxSet).num;
  dVar16 = 0.0;
  dVar17 = 0.0;
  if (iVar12 < 1 || iVar10 < 1) {
LAB_001faca4:
    return dVar17 + dVar16;
  }
  uVar6 = (ulong)(iVar12 - 1);
  uVar8 = (ulong)(iVar10 - 1);
  piVar1 = (this->super_IdxSet).idx;
  pdVar2 = (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = (w->super_IdxSet).idx;
  pdVar4 = (w->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = uVar6;
  uVar13 = uVar8;
  dVar15 = 0.0;
LAB_001fabcc:
  iVar10 = piVar3[uVar11];
  do {
    iVar12 = piVar1[uVar13];
    uVar6 = (ulong)(int)uVar6;
    while( true ) {
      iVar7 = (int)uVar8;
      if ((iVar7 == 0) || (iVar5 = (int)uVar6, iVar5 == 0)) {
        lVar9 = (long)iVar7;
        while ((bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14 && (iVar12 != iVar10))) {
          iVar12 = piVar1[lVar9];
        }
        while ((bVar14 = uVar6 != 0, uVar6 = uVar6 - 1, bVar14 && (iVar12 != iVar10))) {
          iVar10 = piVar3[uVar6];
        }
        dVar17 = dVar15;
        if (iVar12 == iVar10) {
          dVar18 = pdVar2[iVar12] * pdVar4[iVar12];
          dVar17 = dVar15 + dVar18;
          dVar16 = dVar16 + (dVar18 - (dVar17 - dVar15)) + (dVar15 - (dVar17 - (dVar17 - dVar15)));
        }
        goto LAB_001faca4;
      }
      if (iVar12 == iVar10) {
        dVar17 = pdVar2[iVar12] * pdVar4[iVar12];
        dVar18 = dVar15 + dVar17;
        dVar16 = dVar16 + (dVar17 - (dVar18 - dVar15)) + (dVar15 - (dVar18 - (dVar18 - dVar15)));
        uVar8 = (ulong)(iVar7 - 1U);
        uVar13 = (ulong)(int)(iVar7 - 1U);
        uVar6 = (ulong)(iVar5 - 1U);
        uVar11 = (ulong)(int)(iVar5 - 1U);
        dVar15 = dVar18;
        goto LAB_001fabcc;
      }
      if (iVar12 != iVar10 && iVar10 <= iVar12) break;
      uVar6 = uVar6 - 1;
      iVar10 = piVar3[iVar5 + -1];
    }
    uVar8 = (ulong)(iVar7 - 1U);
    uVar13 = (ulong)(int)(iVar7 - 1U);
  } while( true );
}

Assistant:

R operator*(const SSVectorBase<S>& w)
   {
      setup();

      StableSum<R> x;
      int i = size() - 1;
      int j = w.size() - 1;

      // both *this and w non-zero vectors?
      if(i >= 0 && j >= 0)
      {
         int vi = index(i);
         int wj = w.index(j);

         while(i != 0 && j != 0)
         {
            if(vi == wj)
            {
               x += VectorBase<R>::val[vi] * R(w.val[wj]);
               vi = index(--i);
               wj = w.index(--j);
            }
            else if(vi > wj)
               vi = index(--i);
            else
               wj = w.index(--j);
         }

         /* check remaining indices */

         while(i != 0 && vi != wj)
            vi = index(--i);

         while(j != 0 && vi != wj)
            wj = w.index(--j);

         if(vi == wj)
            x += VectorBase<R>::val[vi] * R(w.val[wj]);
      }

      return x;
   }